

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface.cc
# Opt level: O0

void google::protobuf::compiler::anon_unknown_0::GatherOccupiedFieldRanges
               (Descriptor *descriptor,
               set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
               *ranges,vector<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
                       *nested_messages)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  Type TVar4;
  ExtensionRange *__a;
  ExtensionRange *pEVar5;
  ReservedRange *__a_00;
  ReservedRange *pRVar6;
  pair<std::_Rb_tree_const_iterator<std::pair<int,_int>_>,_bool> pVar7;
  pair<std::_Rb_tree_const_iterator<const_google::protobuf::Descriptor_*>,_bool> pVar8;
  _Self local_108;
  _Self local_100;
  Descriptor *local_f8;
  Descriptor *nested_desc;
  _Rb_tree_const_iterator<std::pair<int,_int>_> _Stack_e8;
  int i_3;
  undefined1 local_e0;
  pair<int,_int> local_d4;
  int local_cc;
  _Rb_tree_const_iterator<std::pair<int,_int>_> _Stack_c8;
  int i_2;
  undefined1 local_c0;
  pair<int,_int> local_b4;
  int local_ac;
  _Rb_tree_const_iterator<const_google::protobuf::Descriptor_*> _Stack_a8;
  int i_1;
  undefined1 local_a0;
  Descriptor *local_98;
  _Base_ptr local_90;
  undefined1 local_88;
  int local_80;
  int local_7c;
  pair<int,_int> local_78;
  FieldDescriptor *local_70;
  FieldDescriptor *fd;
  int local_54;
  undefined1 local_50 [4];
  int i;
  set<const_google::protobuf::Descriptor_*,_std::less<const_google::protobuf::Descriptor_*>,_std::allocator<const_google::protobuf::Descriptor_*>_>
  groups;
  vector<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
  *nested_messages_local;
  set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
  *ranges_local;
  Descriptor *descriptor_local;
  
  groups._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)nested_messages;
  std::
  set<const_google::protobuf::Descriptor_*,_std::less<const_google::protobuf::Descriptor_*>,_std::allocator<const_google::protobuf::Descriptor_*>_>
  ::set((set<const_google::protobuf::Descriptor_*,_std::less<const_google::protobuf::Descriptor_*>,_std::allocator<const_google::protobuf::Descriptor_*>_>
         *)local_50);
  local_54 = 0;
  while( true ) {
    iVar1 = local_54;
    iVar3 = Descriptor::field_count(descriptor);
    if (iVar3 <= iVar1) break;
    local_70 = Descriptor::field(descriptor,local_54);
    local_7c = FieldDescriptor::number(local_70);
    local_80 = FieldDescriptor::number(local_70);
    local_80 = local_80 + 1;
    std::pair<int,_int>::pair<int,_int,_true>(&local_78,&local_7c,&local_80);
    pVar7 = std::
            set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
            ::insert(ranges,&local_78);
    local_90 = (_Base_ptr)pVar7.first._M_node;
    local_88 = pVar7.second;
    TVar4 = FieldDescriptor::type(local_70);
    if (TVar4 == TYPE_GROUP) {
      local_98 = FieldDescriptor::message_type(local_70);
      pVar8 = std::
              set<const_google::protobuf::Descriptor_*,_std::less<const_google::protobuf::Descriptor_*>,_std::allocator<const_google::protobuf::Descriptor_*>_>
              ::insert((set<const_google::protobuf::Descriptor_*,_std::less<const_google::protobuf::Descriptor_*>,_std::allocator<const_google::protobuf::Descriptor_*>_>
                        *)local_50,&local_98);
      _Stack_a8 = pVar8.first._M_node;
      local_a0 = pVar8.second;
    }
    local_54 = local_54 + 1;
  }
  local_ac = 0;
  while( true ) {
    iVar1 = local_ac;
    iVar3 = Descriptor::extension_range_count(descriptor);
    if (iVar3 <= iVar1) break;
    __a = Descriptor::extension_range(descriptor,local_ac);
    pEVar5 = Descriptor::extension_range(descriptor,local_ac);
    std::pair<int,_int>::pair<int,_int,_true>(&local_b4,&__a->start,&pEVar5->end);
    pVar7 = std::
            set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
            ::insert(ranges,&local_b4);
    _Stack_c8 = pVar7.first._M_node;
    local_c0 = pVar7.second;
    local_ac = local_ac + 1;
  }
  local_cc = 0;
  while( true ) {
    iVar1 = local_cc;
    iVar3 = Descriptor::reserved_range_count(descriptor);
    if (iVar3 <= iVar1) break;
    __a_00 = Descriptor::reserved_range(descriptor,local_cc);
    pRVar6 = Descriptor::reserved_range(descriptor,local_cc);
    std::pair<int,_int>::pair<int,_int,_true>(&local_d4,&__a_00->start,&pRVar6->end);
    pVar7 = std::
            set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
            ::insert(ranges,&local_d4);
    _Stack_e8 = pVar7.first._M_node;
    local_e0 = pVar7.second;
    local_cc = local_cc + 1;
  }
  nested_desc._4_4_ = 0;
  while( true ) {
    iVar1 = nested_desc._4_4_;
    iVar3 = Descriptor::nested_type_count(descriptor);
    if (iVar3 <= iVar1) break;
    local_f8 = Descriptor::nested_type(descriptor,nested_desc._4_4_);
    local_100._M_node =
         (_Base_ptr)
         std::
         set<const_google::protobuf::Descriptor_*,_std::less<const_google::protobuf::Descriptor_*>,_std::allocator<const_google::protobuf::Descriptor_*>_>
         ::find((set<const_google::protobuf::Descriptor_*,_std::less<const_google::protobuf::Descriptor_*>,_std::allocator<const_google::protobuf::Descriptor_*>_>
                 *)local_50,&local_f8);
    local_108._M_node =
         (_Base_ptr)
         std::
         set<const_google::protobuf::Descriptor_*,_std::less<const_google::protobuf::Descriptor_*>,_std::allocator<const_google::protobuf::Descriptor_*>_>
         ::end((set<const_google::protobuf::Descriptor_*,_std::less<const_google::protobuf::Descriptor_*>,_std::allocator<const_google::protobuf::Descriptor_*>_>
                *)local_50);
    bVar2 = std::operator!=(&local_100,&local_108);
    if (bVar2) {
      GatherOccupiedFieldRanges
                (local_f8,ranges,
                 (vector<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
                  *)groups._M_t._M_impl.super__Rb_tree_header._M_node_count);
    }
    else {
      std::
      vector<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
      ::push_back((vector<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
                   *)groups._M_t._M_impl.super__Rb_tree_header._M_node_count,&local_f8);
    }
    nested_desc._4_4_ = nested_desc._4_4_ + 1;
  }
  std::
  set<const_google::protobuf::Descriptor_*,_std::less<const_google::protobuf::Descriptor_*>,_std::allocator<const_google::protobuf::Descriptor_*>_>
  ::~set((set<const_google::protobuf::Descriptor_*,_std::less<const_google::protobuf::Descriptor_*>,_std::allocator<const_google::protobuf::Descriptor_*>_>
          *)local_50);
  return;
}

Assistant:

void GatherOccupiedFieldRanges(
    const Descriptor* descriptor, std::set<FieldRange>* ranges,
    std::vector<const Descriptor*>* nested_messages) {
  std::set<const Descriptor*> groups;
  for (int i = 0; i < descriptor->field_count(); ++i) {
    const FieldDescriptor* fd = descriptor->field(i);
    ranges->insert(FieldRange(fd->number(), fd->number() + 1));
    if (fd->type() == FieldDescriptor::TYPE_GROUP) {
      groups.insert(fd->message_type());
    }
  }
  for (int i = 0; i < descriptor->extension_range_count(); ++i) {
    ranges->insert(FieldRange(descriptor->extension_range(i)->start,
                              descriptor->extension_range(i)->end));
  }
  for (int i = 0; i < descriptor->reserved_range_count(); ++i) {
    ranges->insert(FieldRange(descriptor->reserved_range(i)->start,
                              descriptor->reserved_range(i)->end));
  }
  // Handle the nested messages/groups in declaration order to make it
  // post-order strict.
  for (int i = 0; i < descriptor->nested_type_count(); ++i) {
    const Descriptor* nested_desc = descriptor->nested_type(i);
    if (groups.find(nested_desc) != groups.end()) {
      GatherOccupiedFieldRanges(nested_desc, ranges, nested_messages);
    } else {
      nested_messages->push_back(nested_desc);
    }
  }
}